

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O1

string * __thiscall
soul::CompileMessage::getSeverity_abi_cxx11_(string *__return_storage_ptr__,CompileMessage *this)

{
  char *pcVar1;
  char *pcVar2;
  
  if ((this->type & ~internalCompilerError) == error) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "error";
    pcVar1 = "";
  }
  else {
    if (this->type != warning) {
      throwInternalCompilerError("getSeverity",0x53);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "warning";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string CompileMessage::getSeverity() const
{
    if (isError())    return "error";
    if (isWarning())  return "warning";

    SOUL_ASSERT_FALSE;
    return {};
}